

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O3

Am_Value add_offset(Am_Value *v,Am_Value *delta,Direction d,Am_Value *ref,float attenuation)

{
  ushort uVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *initial;
  ostream *poVar4;
  undefined4 in_register_00000014;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_01;
  anon_union_8_8_ea4c8939_for_value aVar5;
  Am_Value *in_R8;
  float fVar6;
  float fVar7;
  float fVar8;
  Am_Value AVar9;
  Am_Value_List ldelta;
  Am_Value_List result;
  Am_Value_List lref;
  Am_Value_List lv;
  Am_Value_List local_b0;
  Am_Value_List local_a0;
  Am_Value_List local_90;
  Am_Value_List local_80;
  Am_Value local_70;
  Am_Value local_60;
  Am_Value local_50;
  Am_Value local_40;
  
  pAVar3 = (Am_Value *)CONCAT44(in_register_00000014,d);
  uVar1 = delta->type;
  if (uVar1 - 2 < 2) {
    fVar6 = Am_Value::operator_cast_to_float(delta);
    fVar7 = Am_Value::operator_cast_to_float(pAVar3);
    fVar7 = fVar7 * attenuation;
    fVar8 = Am_Value::operator_cast_to_float(in_R8);
    if (fVar6 < fVar8 == ((int)ref == 0)) {
      fVar7 = -fVar7;
    }
    v->type = 2;
    v->value = (anon_union_8_8_ea4c8939_for_value)(long)(int)(fVar6 + fVar7);
    aVar5 = extraout_RDX;
  }
  else if (uVar1 == 5) {
    fVar6 = Am_Value::operator_cast_to_float(delta);
    fVar7 = Am_Value::operator_cast_to_float(pAVar3);
    fVar7 = fVar7 * attenuation;
    fVar8 = Am_Value::operator_cast_to_float(in_R8);
    if (fVar6 < fVar8 == ((int)ref == 0)) {
      fVar7 = -fVar7;
    }
    v->type = 5;
    (v->value).float_value = fVar6 + fVar7;
    aVar5 = extraout_RDX_00;
  }
  else {
    if ((uVar1 != 0x2000) || (bVar2 = Am_Value_List::Test(delta), !bVar2)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar4 = std::operator<<(poVar4,"Exaggerated_Animator can\'t handle type of ");
      poVar4 = operator<<(poVar4,delta);
      std::endl<char,std::char_traits<char>>(poVar4);
      Am_Error();
    }
    Am_Value_List::Am_Value_List(&local_80,delta);
    Am_Value_List::Am_Value_List(&local_b0,pAVar3);
    Am_Value_List::Am_Value_List(&local_90,in_R8);
    Am_Value_List::Am_Value_List(&local_a0);
    Am_Value_List::Start(&local_80);
    Am_Value_List::Start(&local_b0);
    Am_Value_List::Start(&local_90);
    while (bVar2 = Am_Value_List::Last(&local_80), !bVar2) {
      pAVar3 = Am_Value_List::Get(&local_80);
      Am_Value::Am_Value(&local_50,pAVar3);
      pAVar3 = Am_Value_List::Get(&local_b0);
      Am_Value::Am_Value(&local_60,pAVar3);
      pAVar3 = Am_Value_List::Get(&local_90);
      Am_Value::Am_Value(&local_70,pAVar3);
      add_offset(&local_40,&local_50,(Direction)&local_60,(Am_Value *)((ulong)ref & 0xffffffff),
                 attenuation);
      Am_Value_List::Add(&local_a0,&local_40,Am_TAIL,true);
      Am_Value::~Am_Value(&local_40);
      Am_Value::~Am_Value(&local_70);
      Am_Value::~Am_Value(&local_60);
      Am_Value::~Am_Value(&local_50);
      Am_Value_List::Next(&local_80);
      Am_Value_List::Next(&local_b0);
      Am_Value_List::Next(&local_90);
    }
    initial = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_a0);
    Am_Value::Am_Value(v,initial);
    Am_Value_List::~Am_Value_List(&local_a0);
    Am_Value_List::~Am_Value_List(&local_90);
    Am_Value_List::~Am_Value_List(&local_b0);
    Am_Value_List::~Am_Value_List(&local_80);
    aVar5 = extraout_RDX_01;
  }
  AVar9.value.wrapper_value = aVar5.wrapper_value;
  AVar9._0_8_ = v;
  return AVar9;
}

Assistant:

Am_Value
add_offset(Am_Value v, Am_Value delta, Direction d, Am_Value ref,
           float attenuation = 1.0)
{
  switch (v.type) {
  case Am_INT:
  case Am_LONG: {
    float fv = v;
    float fd = ((float)delta) * attenuation;
    float fref = ref;

    return (int)(((int)(d == AWAYFROM) ^ (int)(fv < fref)) ? fv + fd : fv - fd);
  }

  case Am_FLOAT: {
    float fv = v;
    float fd = ((float)delta) * attenuation;
    float fref = ref;

    return ((int)(d == AWAYFROM) ^ (int)(fv < fref)) ? fv + fd : fv - fd;
  }
  case Am_WRAPPER:
    if (Am_Value_List::Test(v)) {
      Am_Value_List lv = v;
      Am_Value_List ldelta = delta;
      Am_Value_List lref = ref;
      Am_Value_List result;

      for (lv.Start(), ldelta.Start(), lref.Start(); !lv.Last();
           lv.Next(), ldelta.Next(), lref.Next())
        result.Add(
            add_offset(lv.Get(), ldelta.Get(), d, lref.Get(), attenuation));
      return Am_Value(result);
    }
  // else fall through
  default:
    Am_ERROR("Exaggerated_Animator can't handle type of " << v);
    return Am_No_Value;
  }
}